

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::SerializeInt(IMkvWriter *writer,int64 value,int32 size)

{
  int iVar1;
  undefined1 local_39;
  int32 status;
  uint8 b;
  int64 bb;
  int32 bit_count;
  int32 byte_count;
  int32 i;
  int32 size_local;
  int64 value_local;
  IMkvWriter *writer_local;
  
  if (((writer == (IMkvWriter *)0x0) || (size < 1)) || (8 < size)) {
    writer_local._4_4_ = -1;
  }
  else {
    byte_count = size;
    _i = value;
    value_local = (int64)writer;
    for (bit_count = 1; bit_count <= byte_count; bit_count = bit_count + 1) {
      bb._4_4_ = byte_count - bit_count;
      bb._0_4_ = bb._4_4_ * 8;
      _status = _i >> ((byte)(int)bb & 0x3f);
      local_39 = (undefined1)_status;
      iVar1 = (*(code *)**(undefined8 **)value_local)(value_local,&local_39,1);
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    writer_local._4_4_ = 0;
  }
  return writer_local._4_4_;
}

Assistant:

int32 SerializeInt(IMkvWriter* writer, int64 value, int32 size) {
  if (!writer || size < 1 || size > 8)
    return -1;

  for (int32 i = 1; i <= size; ++i) {
    const int32 byte_count = size - i;
    const int32 bit_count = byte_count * 8;

    const int64 bb = value >> bit_count;
    const uint8 b = static_cast<uint8>(bb);

    const int32 status = writer->Write(&b, 1);

    if (status < 0)
      return status;
  }

  return 0;
}